

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O0

string * __thiscall
verilogAST::Module::emitModuleHeader_abi_cxx11_(string *__return_storage_ptr__,Module *this)

{
  bool bVar1;
  pointer pEVar2;
  pointer pAVar3;
  allocator<char> local_219;
  string local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0;
  value_type local_1c0;
  reference local_1a0;
  unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> *it_1;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports_strs;
  string local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  reference local_68;
  pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  *it;
  iterator __end2;
  iterator __begin2;
  Parameters *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_strs;
  Module *this_local;
  string *module_header_str;
  
  std::operator+(__return_storage_ptr__,"module ",&this->name);
  bVar1 = std::
          vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
          ::empty(&this->parameters);
  if (!bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," #(\n    ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    __end2 = std::
             vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::begin(&this->parameters);
    it = (pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
          *)std::
            vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
            ::end(&this->parameters);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                                       *)&it), bVar1) {
      local_68 = __gnu_cxx::
                 __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                 ::operator*(&__end2);
      variant_to_string<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Vector,std::default_delete<verilogAST::Vector>>>
                (&local_e8,&local_68->first);
      std::operator+(&local_c8,"parameter ",&local_e8);
      std::operator+(&local_a8,&local_c8," = ");
      pEVar2 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
               ::operator->(&local_68->second);
      (**(pEVar2->super_Node)._vptr_Node)(&local_108);
      std::operator+(&local_88,&local_a8,&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      __gnu_cxx::
      __normal_iterator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_140,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,",\n    ",
               (allocator<char> *)
               ((long)&ports_strs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    join(&local_128,&local_140,&local_160);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ports_strs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_140);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n)");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," (\n    ");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
           ::begin(&this->ports);
  it_1 = (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> *)
         std::
         vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
         ::end(&this->ports);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
                                     *)&it_1), bVar1) {
    local_1a0 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
                ::operator*(&__end1);
    pAVar3 = std::
             unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>::
             operator->(local_1a0);
    (**(pAVar3->super_Node)._vptr_Node)(&local_1c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,",\n    ",&local_219);
  join(&local_1e0,&local_1f8,&local_218);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n);\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string Module::emitModuleHeader() {
  std::string module_header_str = "module " + name;

  // emit parameter string
  if (!parameters.empty()) {
    module_header_str += " #(\n    ";
    std::vector<std::string> param_strs;
    for (auto &it : parameters) {
      param_strs.push_back("parameter " + variant_to_string(it.first) + " = " +
                           it.second->toString());
    }
    module_header_str += join(param_strs, ",\n    ");
    module_header_str += "\n)";
  }

  // emit port string
  module_header_str += " (\n    ";
  std::vector<std::string> ports_strs;
  for (auto &it : ports) ports_strs.push_back(it->toString());
  module_header_str += join(ports_strs, ",\n    ");
  module_header_str += "\n);\n";
  return module_header_str;
}